

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O2

Plausibility __thiscall
capnp::compiler::CompilerMain::isPlausiblyText
          (CompilerMain *this,ArrayPtr<const_unsigned_char> prefix)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  size_t sVar4;
  int iVar5;
  
  sVar4 = 0;
  iVar5 = 0;
  do {
    if (prefix.size_ == sVar4) {
      return PLAUSIBLE;
    }
    bVar1 = prefix.ptr[sVar4];
    uVar3 = (ulong)bVar1;
    if (iVar5 == 2) {
      if (bVar1 == 0x22) {
        return PLAUSIBLE;
      }
      if (bVar1 == 0x27) {
        return PLAUSIBLE;
      }
LAB_0011f3a2:
      if (((bVar1 != 10 && bVar1 < 0x20) && (bVar1 & 0xfb) != 9) && bVar1 != 0xb) {
        return IMPOSSIBLE;
      }
      iVar2 = iVar5;
      if (bVar1 == 0x7f) {
        return IMPOSSIBLE;
      }
    }
    else if (iVar5 == 1) {
      iVar2 = 0;
      if (bVar1 != 10) goto LAB_0011f3a2;
    }
    else {
      if (0x28 < bVar1) {
        return IMPOSSIBLE;
      }
      if ((0x100002e00U >> (uVar3 & 0x3f) & 1) != 0) goto LAB_0011f3a2;
      if (uVar3 == 0x23) {
        iVar2 = 1;
      }
      else {
        iVar2 = 2;
        if (uVar3 != 0x28) {
          return IMPOSSIBLE;
        }
      }
    }
    iVar5 = iVar2;
    sVar4 = sVar4 + 1;
  } while( true );
}

Assistant:

Plausibility isPlausiblyText(kj::ArrayPtr<const byte> prefix) {
    enum { PREAMBLE, COMMENT, BODY } state = PREAMBLE;

    for (char c: prefix.asChars()) {
      switch (state) {
        case PREAMBLE:
          // Before opening parenthesis.
          switch (c) {
            case '(': state = BODY; continue;
            case '#': state = COMMENT; continue;
            case ' ':
            case '\n':
            case '\r':
            case '\t':
            case '\v':
              // whitespace
              break;
            default:
              // Not whitespace, not comment, not open parenthesis. Impossible!
              return IMPOSSIBLE;
          }
          break;
        case COMMENT:
          switch (c) {
            case '\n': state = PREAMBLE; continue;
            default: break;
          }
          break;
        case BODY:
          switch (c) {
            case '\"':
            case '\'':
              // String literal. Let's stop here before things get complicated.
              return PLAUSIBLE;
            default:
              break;
          }
          break;
      }

      if ((static_cast<uint8_t>(c) < 0x20 && c != '\n' && c != '\r' && c != '\t' && c != '\v')
          || c == 0x7f) {
        // Unprintable character.
        return IMPOSSIBLE;
      }
    }

    return PLAUSIBLE;
  }